

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void save_cpu_state(DisasContext_conflict6 *ctx,int do_save_pc)

{
  TCGContext_conflict6 *tcg_ctx_00;
  uint uVar1;
  TCGContext_conflict6 *tcg_ctx;
  int do_save_pc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((do_save_pc != 0) && ((ctx->base).pc_next != ctx->saved_pc)) {
    gen_save_pc(tcg_ctx_00,(ctx->base).pc_next);
    ctx->saved_pc = (ctx->base).pc_next;
  }
  if (ctx->hflags != ctx->saved_hflags) {
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->hflags,ctx->hflags);
    ctx->saved_hflags = ctx->hflags;
    uVar1 = ctx->hflags & 0x803800;
    if (((uVar1 == 0x800) || (uVar1 == 0x1000)) || (uVar1 == 0x1800)) {
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->btarget,ctx->btarget);
    }
  }
  return;
}

Assistant:

static inline void save_cpu_state(DisasContext *ctx, int do_save_pc)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    LOG_DISAS("hflags %08x saved %08x\n", ctx->hflags, ctx->saved_hflags);
    if (do_save_pc && ctx->base.pc_next != ctx->saved_pc) {
        gen_save_pc(tcg_ctx, ctx->base.pc_next);
        ctx->saved_pc = ctx->base.pc_next;
    }
    if (ctx->hflags != ctx->saved_hflags) {
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->hflags, ctx->hflags);
        ctx->saved_hflags = ctx->hflags;
        switch (ctx->hflags & MIPS_HFLAG_BMASK_BASE) {
        case MIPS_HFLAG_BR:
            break;
        case MIPS_HFLAG_BC:
        case MIPS_HFLAG_BL:
        case MIPS_HFLAG_B:
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->btarget, ctx->btarget);
            break;
        }
    }
}